

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<char>::insert(QPodArrayOps<char> *this,qsizetype i,char *data,qsizetype n)

{
  char *__dest;
  QArrayDataPointer<char> *in_RCX;
  void *in_RDX;
  long in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  char *where;
  GrowthPosition pos;
  DataPointer oldData;
  QArrayDataPointer<char> *this_00;
  qsizetype in_stack_ffffffffffffffb0;
  GrowthPosition where_00;
  QArrayDataPointer<char> local_28;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  where_00 = GrowsAtEnd;
  if ((in_RDI[2] != (char *)0x0) && (in_RSI == 0)) {
    where_00 = GrowsAtBeginning;
  }
  local_28.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_28.size = -0x5555555555555556;
  this_00 = &local_28;
  local_10 = in_RDX;
  QArrayDataPointer<char>::QArrayDataPointer(this_00);
  QArrayDataPointer<char>::detachAndGrow(in_RCX,where_00,in_stack_ffffffffffffffb0,in_RDI,this_00);
  __dest = createHole((QPodArrayOps<char> *)in_RCX,where_00,in_stack_ffffffffffffffb0,
                      (qsizetype)in_RDI);
  memcpy(__dest,local_10,(size_t)in_RCX);
  QArrayDataPointer<char>::~QArrayDataPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, const T *data, qsizetype n)
    {
        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        DataPointer oldData;
        this->detachAndGrow(pos, n, &data, &oldData);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        ::memcpy(static_cast<void *>(where), static_cast<const void *>(data), n * sizeof(T));
    }